

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O0

void __thiscall cali::AttributeExtract::~AttributeExtract(AttributeExtract *this)

{
  AttributeExtract *this_local;
  
  std::__shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>
              *)this);
  std::shared_ptr<cali::AttributeExtract::AttributeExtractImpl>::~shared_ptr(&this->mP);
  return;
}

Assistant:

AttributeExtract::~AttributeExtract()
{
    mP.reset();
}